

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

void ctype_prepstr(CTRepr *ctr,char *str,MSize len)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = ctr->pb;
  uVar1 = (ulong)len;
  if (pcVar2 < ctr->buf + uVar1 + 1) {
    ctr->ok = 0;
    return;
  }
  if (ctr->needsp != 0) {
    pcVar2[-1] = ' ';
    pcVar2 = pcVar2 + -1;
  }
  ctr->needsp = 1;
  if (len != 0) {
    lVar3 = 0;
    do {
      pcVar2[lVar3 + -1] = str[lVar3 + (uVar1 - 1)];
      lVar3 = lVar3 + -1;
    } while (-lVar3 != uVar1);
  }
  ctr->pb = pcVar2 + -uVar1;
  return;
}

Assistant:

static void ctype_prepstr(CTRepr *ctr, const char *str, MSize len)
{
  char *p = ctr->pb;
  if (ctr->buf + len+1 > p) { ctr->ok = 0; return; }
  if (ctr->needsp) *--p = ' ';
  ctr->needsp = 1;
  p -= len;
  while (len-- > 0) p[len] = str[len];
  ctr->pb = p;
}